

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::sra_dhl(SM83 *this)

{
  byte bVar1;
  unsigned_short *in_RAX;
  byte value;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x46;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  SRA (HL)\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,in_RAX);
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  value = bVar1 >> 1 | bVar1 & 0x80;
  (this->field_0).field_1.f = (bVar1 & 1) << 4 | (this->field_0).field_1.f & 0xf | (value == 0) << 7
  ;
  Bus::Write8(this->bus,(this->field_3).hl,value,true);
  return;
}

Assistant:

void SM83::sra_dhl() {
    LTRACE("SRA (HL)");

    u8 value = bus.Read8(hl);
    u8 bit7 = value & (1 << 7);
    u8 result = value >> 1;

    SetZeroFlag((result | bit7) == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(value & 0x1);

    bus.Write8(hl, result | bit7);
}